

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian-branching.hxx
# Opt level: O2

double __thiscall
lineage::heuristics::branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>::
optimize(MaskedHungarianBranching<lineage::heuristics::PartitionGraph> *this)

{
  long lVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *second;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *first;
  double dVar2;
  double dVar3;
  future<double> second_handle;
  undefined1 local_58 [8];
  future<double> first_handle;
  MaskedHungarianBranching<lineage::heuristics::PartitionGraph> *local_40;
  pointer local_38;
  
  (*(this->super_HungarianBranching<lineage::heuristics::PartitionGraph>).
    super_BranchingOptimizer<lineage::heuristics::PartitionGraph>._vptr_BranchingOptimizer[1])();
  lVar1 = HungarianBranching<lineage::heuristics::PartitionGraph>::getFrame
                    (&this->super_HungarianBranching<lineage::heuristics::PartitionGraph>,this->A_);
  if (lVar1 == 0) {
    first = &this->second_;
    second = &this->third_;
  }
  else {
    if (lVar1 != ((this->super_HungarianBranching<lineage::heuristics::PartitionGraph>).
                  super_BranchingOptimizer<lineage::heuristics::PartitionGraph>.graph_)->data_->
                 problemGraph->numberOfFrames_ - 1) {
      second_handle.super___basic_future<double>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)HungarianBranching<lineage::heuristics::PartitionGraph>::optimizeStep;
      second_handle.super___basic_future<double>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_58 = (undefined1  [8])((ulong)local_58 & 0xffffffffffffff00);
      local_40 = this;
      std::
      async<double(lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>::*)(std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,bool),lineage::heuristics::branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>*,std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,bool>
                ((launch)&first_handle,
                 (offset_in_HungarianBranching<lineage::heuristics::PartitionGraph>_to_subr *)0x1,
                 (MaskedHungarianBranching<lineage::heuristics::PartitionGraph> **)&second_handle,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_40,&this->first_,
                 (bool *)&this->second_);
      local_40 = (MaskedHungarianBranching<lineage::heuristics::PartitionGraph> *)
                 HungarianBranching<lineage::heuristics::PartitionGraph>::optimizeStep;
      local_38 = (pointer)0x0;
      local_58 = (undefined1  [8])this;
      std::
      async<double(lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>::*)(std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,bool),lineage::heuristics::branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>*,std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,bool>
                ((launch)&second_handle,
                 (offset_in_HungarianBranching<lineage::heuristics::PartitionGraph>_to_subr *)0x1,
                 &local_40,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_58,
                 &this->second_,(bool *)&this->third_);
      dVar2 = std::future<double>::get(&first_handle);
      dVar3 = std::future<double>::get(&second_handle);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&second_handle.super___basic_future<double>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&first_handle.super___basic_future<double>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      return dVar2 + dVar3;
    }
    first = &this->first_;
    second = &this->second_;
  }
  dVar2 = HungarianBranching<lineage::heuristics::PartitionGraph>::optimizeStep
                    (&this->super_HungarianBranching<lineage::heuristics::PartitionGraph>,first,
                     second,false);
  return dVar2;
}

Assistant:

inline double
MaskedHungarianBranching<GRAPH>::optimize()
{
    setup();

    const auto centerFrame = this->getFrame(A_);

    // border cases where only one step has to be solved.
    // We handle these separately to avoid unnecessary overhead
    // from std::async.
    if (centerFrame == 0)
        return this->optimizeStep(second_, third_, false);
    if (centerFrame == this->getMaxFrame() - 1)
        return this->optimizeStep(first_, second_, false);

    // solve subproblem in {t-1,t} and {t,t+1} in parallel.
    auto first_handle = std::async(
        std::launch::async, &MaskedHungarianBranching<GRAPH>::optimizeStep,
        this, first_, second_, false);

    auto second_handle = std::async(
        std::launch::async, &MaskedHungarianBranching<GRAPH>::optimizeStep,
        this, second_, third_, false);

    const auto objective = first_handle.get() + second_handle.get();

    return objective;
}